

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O1

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  OPJ_INT16 *pOVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  opj_pi_resolution_t *poVar20;
  opj_pi_comp_t *poVar21;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    if (pi->first == 0) goto LAB_00124020;
    pi->first = 0;
    pi->layno = (pi->poc).layno0;
    while (pi->layno < (pi->poc).layno1) {
      pi->resno = (pi->poc).resno0;
      while (pi->resno < (pi->poc).resno1) {
        pi->compno = (pi->poc).compno0;
        while (uVar18 = pi->compno, uVar18 < (pi->poc).compno1) {
          uVar9 = pi->resno;
          if (uVar9 < pi->comps[uVar18].numresolutions) {
            if (pi->tp_on == '\0') {
              poVar20 = pi->comps[uVar18].resolutions;
              (pi->poc).precno1 = poVar20[uVar9].ph * poVar20[uVar9].pw;
            }
            pi->precno = (pi->poc).precno0;
            while (pi->precno < (pi->poc).precno1) {
              uVar18 = pi->precno * pi->step_p + pi->step_c * pi->compno +
                       pi->step_r * pi->resno + pi->step_l * pi->layno;
              if (pi->include_size <= uVar18) {
                return 0;
              }
              pOVar10 = pi->include;
              uVar13 = (ulong)uVar18;
              if (pOVar10[uVar13] == 0) {
LAB_0012402f:
                pOVar10[uVar13] = 1;
                return 1;
              }
LAB_00124020:
              pi->precno = pi->precno + 1;
            }
          }
          pi->compno = pi->compno + 1;
        }
        pi->resno = pi->resno + 1;
      }
      pi->layno = pi->layno + 1;
    }
    break;
  case OPJ_RLCP:
    if (pi->first == 0) goto LAB_0012410f;
    pi->first = 0;
    pi->resno = (pi->poc).resno0;
    while (pi->resno < (pi->poc).resno1) {
      pi->layno = (pi->poc).layno0;
      while (pi->layno < (pi->poc).layno1) {
        pi->compno = (pi->poc).compno0;
        while (uVar18 = pi->compno, uVar18 < (pi->poc).compno1) {
          uVar9 = pi->resno;
          if (uVar9 < pi->comps[uVar18].numresolutions) {
            if (pi->tp_on == '\0') {
              poVar20 = pi->comps[uVar18].resolutions;
              (pi->poc).precno1 = poVar20[uVar9].ph * poVar20[uVar9].pw;
            }
            pi->precno = (pi->poc).precno0;
            while (pi->precno < (pi->poc).precno1) {
              uVar18 = pi->precno * pi->step_p + pi->step_c * pi->compno +
                       pi->step_r * pi->resno + pi->step_l * pi->layno;
              if (pi->include_size <= uVar18) {
                return 0;
              }
              pOVar10 = pi->include;
              uVar13 = (ulong)uVar18;
              if (pOVar10[uVar13] == 0) goto LAB_0012402f;
LAB_0012410f:
              pi->precno = pi->precno + 1;
            }
          }
          pi->compno = pi->compno + 1;
        }
        pi->layno = pi->layno + 1;
      }
      pi->resno = pi->resno + 1;
    }
    break;
  case OPJ_RPCL:
    if (pi->first == 0) goto LAB_00124438;
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    if ((ulong)pi->numcomps != 0) {
      uVar13 = 0;
      do {
        uVar18 = pi->comps[uVar13].numresolutions;
        uVar14 = (ulong)uVar18;
        if (uVar14 != 0) {
          poVar21 = pi->comps + uVar13;
          poVar20 = poVar21->resolutions;
          lVar15 = 0;
          do {
            uVar18 = uVar18 - 1;
            uVar9 = *(int *)((long)&poVar20->pdx + lVar15) + uVar18;
            if (uVar9 < 0x20) {
              bVar6 = (byte)uVar9;
              if (poVar21->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
                uVar16 = poVar21->dx << (bVar6 & 0x1f);
                uVar9 = pi->dx;
                uVar12 = uVar16;
                if (uVar9 < uVar16) {
                  uVar12 = uVar9;
                }
                if (uVar9 == 0) {
                  uVar12 = uVar16;
                }
                pi->dx = uVar12;
              }
            }
            uVar9 = *(int *)((long)&poVar20->pdy + lVar15) + uVar18;
            if (uVar9 < 0x20) {
              bVar6 = (byte)uVar9;
              if (poVar21->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
                uVar16 = poVar21->dy << (bVar6 & 0x1f);
                uVar9 = pi->dy;
                uVar12 = uVar16;
                if (uVar9 < uVar16) {
                  uVar12 = uVar9;
                }
                if (uVar9 == 0) {
                  uVar12 = uVar16;
                }
                pi->dy = uVar12;
              }
            }
            lVar15 = lVar15 + 0x10;
          } while (uVar14 << 4 != lVar15);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != pi->numcomps);
    }
    if ((pi->dx != 0) && (pi->dy != 0)) {
      if (pi->tp_on == '\0') {
        OVar4 = pi->tx0;
        (pi->poc).ty0 = pi->ty0;
        (pi->poc).tx0 = OVar4;
        (pi->poc).ty1 = pi->ty1;
        (pi->poc).tx1 = pi->tx1;
      }
      pi->resno = (pi->poc).resno0;
      while (pi->resno < (pi->poc).resno1) {
        pi->y = (pi->poc).ty0;
        while (pi->y < (pi->poc).ty1) {
          pi->x = (pi->poc).tx0;
          while (pi->x < (pi->poc).tx1) {
            pi->compno = (pi->poc).compno0;
            while (uVar18 = pi->compno, uVar18 < (pi->poc).compno1) {
              uVar9 = pi->resno;
              uVar12 = pi->comps[uVar18].numresolutions;
              if ((uVar9 < uVar12) && (uVar12 = uVar12 + ~uVar9, uVar12 < 0x20)) {
                poVar21 = pi->comps + uVar18;
                uVar18 = poVar21->dx;
                bVar6 = (byte)uVar12;
                uVar16 = uVar18 << (bVar6 & 0x1f);
                if (uVar16 >> (bVar6 & 0x1f) == uVar18) {
                  uVar1 = poVar21->dy;
                  uVar17 = uVar1 << (bVar6 & 0x1f);
                  if ((uVar17 >> (bVar6 & 0x1f) == uVar1) && (-1 < (int)(uVar17 | uVar16))) {
                    if (uVar18 << (bVar6 & 0x1f) == 0) {
LAB_00124b1e:
                      __assert_fail("b",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                                    ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
                    }
                    lVar15 = (long)(int)uVar16;
                    if (uVar1 << (bVar6 & 0x1f) == 0) goto LAB_00124b1e;
                    poVar20 = poVar21->resolutions + uVar9;
                    lVar19 = (long)(int)uVar17;
                    uVar9 = poVar20->pdx + uVar12;
                    if (((uVar9 < 0x1f) &&
                        (bVar7 = (byte)uVar9, uVar18 <= 0xffffffffU >> (bVar7 & 0x1f))) &&
                       (uVar12 = poVar20->pdy + uVar12, uVar12 < 0x1f)) {
                      bVar8 = (byte)uVar12;
                      uVar9 = uVar1 << (bVar8 & 0x1f);
                      if (uVar9 >> (bVar8 & 0x1f) == uVar1) {
                        iVar11 = (int)((lVar19 + pi->ty0 + -1) / lVar19);
                        if ((pi->y % (int)uVar9 == 0) ||
                           ((pi->y == pi->ty0 &&
                            ((iVar11 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))) {
                          iVar2 = pi->x;
                          iVar3 = (int)((pi->tx0 + lVar15 + -1) / lVar15);
                          if (((iVar2 % (int)(uVar18 << (bVar7 & 0x1f)) == 0) ||
                              ((iVar2 == pi->tx0 &&
                               ((iVar3 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))) &&
                             ((poVar20->pw != 0 &&
                              (((poVar20->ph != 0 &&
                                (iVar3 != (int)(((long)pi->tx1 + lVar15 + -1) / lVar15))) &&
                               (iVar11 != (int)((pi->ty1 + lVar19 + -1) / lVar19))))))) {
                            OVar4 = opj_int_ceildiv(iVar2,uVar16);
                            bVar7 = (byte)poVar20->pdx;
                            OVar5 = opj_int_ceildiv(pi->y,poVar21->dy << (bVar6 & 0x1f));
                            bVar6 = (byte)poVar20->pdy;
                            pi->precno = ((OVar5 >> (bVar6 & 0x1f)) - (iVar11 >> (bVar6 & 0x1f))) *
                                         poVar20->pw +
                                         ((OVar4 >> (bVar7 & 0x1f)) - (iVar3 >> (bVar7 & 0x1f)));
                            pi->layno = (pi->poc).layno0;
                            while (pi->layno < (pi->poc).layno1) {
                              uVar18 = pi->step_p * pi->precno + pi->step_c * pi->compno +
                                       pi->step_r * pi->resno + pi->layno * pi->step_l;
                              if (pi->include_size <= uVar18) {
                                return 0;
                              }
                              pOVar10 = pi->include;
                              uVar13 = (ulong)uVar18;
                              if (pOVar10[uVar13] == 0) goto LAB_0012402f;
LAB_00124438:
                              pi->layno = pi->layno + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pi->compno = pi->compno + 1;
            }
            pi->x = (pi->x + pi->dx) - pi->x % (int)pi->dx;
          }
          pi->y = (pi->y + pi->dy) - pi->y % (int)pi->dy;
        }
        pi->resno = pi->resno + 1;
      }
    }
    break;
  case OPJ_PCRL:
    if (pi->first == 0) {
      poVar21 = pi->comps + pi->compno;
      goto LAB_0012474e;
    }
    pi->first = 0;
    pi->dx = 0;
    pi->dy = 0;
    if ((ulong)pi->numcomps != 0) {
      uVar13 = 0;
      do {
        uVar18 = pi->comps[uVar13].numresolutions;
        uVar14 = (ulong)uVar18;
        if (uVar14 != 0) {
          poVar21 = pi->comps + uVar13;
          poVar20 = poVar21->resolutions;
          lVar15 = 0;
          do {
            uVar18 = uVar18 - 1;
            uVar9 = *(int *)((long)&poVar20->pdx + lVar15) + uVar18;
            if (uVar9 < 0x20) {
              bVar6 = (byte)uVar9;
              if (poVar21->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
                uVar16 = poVar21->dx << (bVar6 & 0x1f);
                uVar9 = pi->dx;
                uVar12 = uVar16;
                if (uVar9 < uVar16) {
                  uVar12 = uVar9;
                }
                if (uVar9 == 0) {
                  uVar12 = uVar16;
                }
                pi->dx = uVar12;
              }
            }
            uVar9 = *(int *)((long)&poVar20->pdy + lVar15) + uVar18;
            if (uVar9 < 0x20) {
              bVar6 = (byte)uVar9;
              if (poVar21->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
                uVar16 = poVar21->dy << (bVar6 & 0x1f);
                uVar9 = pi->dy;
                uVar12 = uVar16;
                if (uVar9 < uVar16) {
                  uVar12 = uVar9;
                }
                if (uVar9 == 0) {
                  uVar12 = uVar16;
                }
                pi->dy = uVar12;
              }
            }
            lVar15 = lVar15 + 0x10;
          } while (uVar14 << 4 != lVar15);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != pi->numcomps);
    }
    if ((pi->dx != 0) && (pi->dy != 0)) {
      if (pi->tp_on == '\0') {
        OVar4 = pi->tx0;
        (pi->poc).ty0 = pi->ty0;
        (pi->poc).tx0 = OVar4;
        (pi->poc).ty1 = pi->ty1;
        (pi->poc).tx1 = pi->tx1;
      }
      pi->y = (pi->poc).ty0;
      while (pi->y < (pi->poc).ty1) {
        pi->x = (pi->poc).tx0;
        while (pi->x < (pi->poc).tx1) {
          pi->compno = (pi->poc).compno0;
          while (pi->compno < (pi->poc).compno1) {
            poVar21 = pi->comps + pi->compno;
            pi->resno = (pi->poc).resno0;
            while( true ) {
              uVar18 = pi->resno;
              uVar9 = (pi->poc).resno1;
              uVar12 = poVar21->numresolutions;
              if (uVar12 <= uVar9) {
                uVar9 = uVar12;
              }
              if (uVar9 <= uVar18) break;
              uVar12 = uVar12 + ~uVar18;
              if (uVar12 < 0x20) {
                uVar9 = poVar21->dx;
                bVar6 = (byte)uVar12;
                uVar16 = uVar9 << (bVar6 & 0x1f);
                if (uVar16 >> (bVar6 & 0x1f) == uVar9) {
                  uVar1 = poVar21->dy;
                  uVar17 = uVar1 << (bVar6 & 0x1f);
                  if ((uVar17 >> (bVar6 & 0x1f) == uVar1) && (-1 < (int)(uVar17 | uVar16))) {
                    if (uVar9 << (bVar6 & 0x1f) == 0) goto LAB_00124b1e;
                    lVar15 = (long)(int)uVar16;
                    if (uVar1 << (bVar6 & 0x1f) == 0) goto LAB_00124b1e;
                    poVar20 = poVar21->resolutions + uVar18;
                    lVar19 = (long)(int)uVar17;
                    uVar18 = poVar20->pdx + uVar12;
                    if (((uVar18 < 0x1f) &&
                        (bVar7 = (byte)uVar18, uVar9 <= 0xffffffffU >> (bVar7 & 0x1f))) &&
                       (uVar12 = poVar20->pdy + uVar12, uVar12 < 0x1f)) {
                      bVar8 = (byte)uVar12;
                      uVar18 = uVar1 << (bVar8 & 0x1f);
                      if (uVar18 >> (bVar8 & 0x1f) == uVar1) {
                        iVar11 = (int)((lVar19 + pi->ty0 + -1) / lVar19);
                        if ((pi->y % (int)uVar18 == 0) ||
                           ((pi->y == pi->ty0 &&
                            ((iVar11 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))) {
                          iVar2 = pi->x;
                          iVar3 = (int)((lVar15 + pi->tx0 + -1) / lVar15);
                          if (((iVar2 % (int)(uVar9 << (bVar7 & 0x1f)) == 0) ||
                              ((iVar2 == pi->tx0 &&
                               ((iVar3 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))) &&
                             ((poVar20->pw != 0 &&
                              (((poVar20->ph != 0 &&
                                (iVar3 != (int)(((long)pi->tx1 + lVar15 + -1) / lVar15))) &&
                               (iVar11 != (int)((pi->ty1 + lVar19 + -1) / lVar19))))))) {
                            OVar4 = opj_int_ceildiv(iVar2,uVar16);
                            bVar7 = (byte)poVar20->pdx;
                            OVar5 = opj_int_ceildiv(pi->y,poVar21->dy << (bVar6 & 0x1f));
                            bVar6 = (byte)poVar20->pdy;
                            pi->precno = ((OVar5 >> (bVar6 & 0x1f)) - (iVar11 >> (bVar6 & 0x1f))) *
                                         poVar20->pw +
                                         ((OVar4 >> (bVar7 & 0x1f)) - (iVar3 >> (bVar7 & 0x1f)));
                            pi->layno = (pi->poc).layno0;
                            while (pi->layno < (pi->poc).layno1) {
                              uVar18 = pi->step_p * pi->precno + pi->step_c * pi->compno +
                                       pi->step_r * pi->resno + pi->layno * pi->step_l;
                              if (pi->include_size <= uVar18) {
                                return 0;
                              }
                              pOVar10 = pi->include;
                              uVar13 = (ulong)uVar18;
                              if (pOVar10[uVar13] == 0) goto LAB_0012402f;
LAB_0012474e:
                              pi->layno = pi->layno + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              pi->resno = pi->resno + 1;
            }
            pi->compno = pi->compno + 1;
          }
          pi->x = (pi->x + pi->dx) - pi->x % (int)pi->dx;
        }
        pi->y = (pi->y + pi->dy) - pi->y % (int)pi->dy;
      }
    }
    break;
  case OPJ_CPRL:
    if (pi->first == 0) {
      poVar21 = pi->comps + pi->compno;
      goto LAB_00124b88;
    }
    pi->first = 0;
    pi->compno = (pi->poc).compno0;
    while (pi->compno < (pi->poc).compno1) {
      poVar21 = pi->comps + pi->compno;
      pi->dx = 0;
      pi->dy = 0;
      uVar18 = poVar21->numresolutions;
      uVar13 = (ulong)uVar18;
      if (uVar13 != 0) {
        poVar20 = poVar21->resolutions;
        lVar15 = 0;
        do {
          uVar18 = uVar18 - 1;
          uVar9 = *(int *)((long)&poVar20->pdx + lVar15) + uVar18;
          if (uVar9 < 0x20) {
            bVar6 = (byte)uVar9;
            if (poVar21->dx <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar16 = poVar21->dx << (bVar6 & 0x1f);
              uVar9 = pi->dx;
              uVar12 = uVar16;
              if (uVar9 < uVar16) {
                uVar12 = uVar9;
              }
              if (uVar9 == 0) {
                uVar12 = uVar16;
              }
              pi->dx = uVar12;
            }
          }
          uVar9 = *(int *)((long)&poVar20->pdy + lVar15) + uVar18;
          if (uVar9 < 0x20) {
            bVar6 = (byte)uVar9;
            if (poVar21->dy <= 0xffffffffU >> (bVar6 & 0x1f)) {
              uVar16 = poVar21->dy << (bVar6 & 0x1f);
              uVar9 = pi->dy;
              uVar12 = uVar16;
              if (uVar9 < uVar16) {
                uVar12 = uVar9;
              }
              if (uVar9 == 0) {
                uVar12 = uVar16;
              }
              pi->dy = uVar12;
            }
          }
          lVar15 = lVar15 + 0x10;
        } while (uVar13 << 4 != lVar15);
      }
      if (pi->dx == 0) {
        return 0;
      }
      if (pi->dy == 0) {
        return 0;
      }
      if (pi->tp_on == '\0') {
        OVar4 = pi->tx0;
        (pi->poc).ty0 = pi->ty0;
        (pi->poc).tx0 = OVar4;
        (pi->poc).ty1 = pi->ty1;
        (pi->poc).tx1 = pi->tx1;
      }
      pi->y = (pi->poc).ty0;
      while (pi->y < (pi->poc).ty1) {
        pi->x = (pi->poc).tx0;
        while (pi->x < (pi->poc).tx1) {
          pi->resno = (pi->poc).resno0;
          while( true ) {
            uVar18 = pi->resno;
            uVar9 = (pi->poc).resno1;
            uVar12 = poVar21->numresolutions;
            if (uVar12 <= uVar9) {
              uVar9 = uVar12;
            }
            if (uVar9 <= uVar18) break;
            uVar12 = uVar12 + ~uVar18;
            if (uVar12 < 0x20) {
              uVar9 = poVar21->dx;
              bVar6 = (byte)uVar12;
              uVar16 = uVar9 << (bVar6 & 0x1f);
              if (uVar16 >> (bVar6 & 0x1f) == uVar9) {
                uVar1 = poVar21->dy;
                uVar17 = uVar1 << (bVar6 & 0x1f);
                if ((uVar17 >> (bVar6 & 0x1f) == uVar1) && (-1 < (int)(uVar17 | uVar16))) {
                  if (uVar9 << (bVar6 & 0x1f) == 0) goto LAB_00124b1e;
                  lVar15 = (long)(int)uVar16;
                  if (uVar1 << (bVar6 & 0x1f) == 0) goto LAB_00124b1e;
                  poVar20 = poVar21->resolutions + uVar18;
                  lVar19 = (long)(int)uVar17;
                  uVar18 = poVar20->pdx + uVar12;
                  if (((uVar18 < 0x1f) &&
                      (bVar7 = (byte)uVar18, uVar9 <= 0xffffffffU >> (bVar7 & 0x1f))) &&
                     (uVar12 = poVar20->pdy + uVar12, uVar12 < 0x1f)) {
                    bVar8 = (byte)uVar12;
                    uVar18 = uVar1 << (bVar8 & 0x1f);
                    if (uVar18 >> (bVar8 & 0x1f) == uVar1) {
                      iVar11 = (int)((lVar19 + pi->ty0 + -1) / lVar19);
                      if ((pi->y % (int)uVar18 == 0) ||
                         ((pi->y == pi->ty0 &&
                          ((iVar11 << (bVar6 & 0x1f) & ~(-1 << (bVar8 & 0x1f))) != 0)))) {
                        iVar2 = pi->x;
                        iVar3 = (int)((lVar15 + pi->tx0 + -1) / lVar15);
                        if (((iVar2 % (int)(uVar9 << (bVar7 & 0x1f)) == 0) ||
                            ((iVar2 == pi->tx0 &&
                             ((iVar3 << (bVar6 & 0x1f) & ~(-1 << (bVar7 & 0x1f))) != 0)))) &&
                           ((poVar20->pw != 0 &&
                            (((poVar20->ph != 0 &&
                              (iVar3 != (int)(((long)pi->tx1 + lVar15 + -1) / lVar15))) &&
                             (iVar11 != (int)((pi->ty1 + lVar19 + -1) / lVar19))))))) {
                          OVar4 = opj_int_ceildiv(iVar2,uVar16);
                          bVar7 = (byte)poVar20->pdx;
                          OVar5 = opj_int_ceildiv(pi->y,poVar21->dy << (bVar6 & 0x1f));
                          bVar6 = (byte)poVar20->pdy;
                          pi->precno = ((OVar5 >> (bVar6 & 0x1f)) - (iVar11 >> (bVar6 & 0x1f))) *
                                       poVar20->pw +
                                       ((OVar4 >> (bVar7 & 0x1f)) - (iVar3 >> (bVar7 & 0x1f)));
                          pi->layno = (pi->poc).layno0;
                          while (pi->layno < (pi->poc).layno1) {
                            uVar18 = pi->step_p * pi->precno + pi->step_c * pi->compno +
                                     pi->step_r * pi->resno + pi->layno * pi->step_l;
                            if (pi->include_size <= uVar18) {
                              return 0;
                            }
                            pOVar10 = pi->include;
                            uVar13 = (ulong)uVar18;
                            if (pOVar10[uVar13] == 0) goto LAB_0012402f;
LAB_00124b88:
                            pi->layno = pi->layno + 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            pi->resno = pi->resno + 1;
          }
          pi->x = (pi->x + pi->dx) - pi->x % (int)pi->dx;
        }
        pi->y = (pi->y + pi->dy) - pi->y % (int)pi->dy;
      }
      pi->compno = pi->compno + 1;
    }
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}